

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

bool Peeps::IsJccOrShiftInstr(Instr *instr)

{
  bool bVar1;
  bool bVar2;
  BranchInstr *this;
  bool local_13;
  bool instrFound;
  Instr *instr_local;
  
  bVar1 = IR::Instr::IsBranchInstr(instr);
  if (bVar1) {
    this = IR::Instr::AsBranchInstr(instr);
    bVar2 = IR::BranchInstr::IsConditional(this);
    bVar1 = true;
    if (bVar2) goto LAB_0083afaa;
  }
  bVar1 = true;
  if ((instr->m_opcode != SHL) && (bVar1 = true, instr->m_opcode != SHR)) {
    bVar1 = instr->m_opcode == SAR;
  }
LAB_0083afaa:
  local_13 = true;
  if (!bVar1) {
    local_13 = instr->m_opcode == SHLD;
  }
  return local_13;
}

Assistant:

bool
Peeps::IsJccOrShiftInstr(IR::Instr *instr)
{
    bool instrFound = (instr->IsBranchInstr() && instr->AsBranchInstr()->IsConditional()) ||
        (instr->m_opcode == Js::OpCode::SHL) || (instr->m_opcode == Js::OpCode::SHR) || (instr->m_opcode == Js::OpCode::SAR);

#if defined(_M_X64)
    instrFound = instrFound || (instr->m_opcode == Js::OpCode::SHLD);
#endif

    return (instrFound);
}